

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reductions.cpp
# Opt level: O1

void __thiscall
MxxReduce_GlobalReduce_Test::~MxxReduce_GlobalReduce_Test(MxxReduce_GlobalReduce_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MxxReduce, GlobalReduce) {
    mxx::comm c;

    // test reduce with zero elements for some processes
    size_t n = 0;
    int presize = 0;
    if (c.rank() % 2 == 0) {
        n = (c.rank()/2+1);
        presize = n*(n-1)/2;
    }
    std::vector<long> local(n);
    for (size_t i = 0; i < n; ++i) {
        local[i] = presize + i + 1;
    }
    long totalsum = mxx::global_reduce(local, [](int x, int y){ return x+y; }, c);
    int nonzero_size = (c.size()+1)/2;
    int num_els = nonzero_size*(nonzero_size+1)/2;
    ASSERT_EQ(num_els*(num_els+1)/2, totalsum);
}